

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

Type __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::generateSupertype
          (HeapTypeGeneratorImpl *this,Type type)

{
  __index_type _Var1;
  pointer pvVar2;
  TypeBuilder *pTVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  size_type __n;
  Type *pTVar7;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> _Var8;
  _Optional_payload_base<unsigned_int> _Var9;
  value_type *pvVar10;
  HeapType HVar11;
  uintptr_t *puVar12;
  uintptr_t uVar13;
  Nullability NVar14;
  uintptr_t local_78;
  Type type_local;
  Iterator __begin3;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  HeapType local_38;
  
  local_78 = type.id;
  cVar5 = wasm::Type::isTuple();
  if (cVar5 != '\0') {
    auStack_58 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = wasm::Type::size();
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,__n);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    type_local.id = (uintptr_t)&local_78;
    pTVar7 = (Type *)wasm::Type::size();
    if (pTVar7 == (Type *)0x0) goto LAB_00154113;
    do {
      do {
        puVar12 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&type_local);
        local_38.id = (uintptr_t)generateSupertype(this,*puVar12);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,(Type *)&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = local_38.id;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar7);
LAB_00154113:
    } while ((uintptr_t *)type_local.id != &local_78);
    pTVar3 = this->builder;
    Tuple::Tuple((Tuple *)&type_local,(TypeList *)auStack_58);
    uVar13 = wasm::TypeBuilder::getTempTupleType((Tuple *)pTVar3);
    if (type_local.id != 0) {
      operator_delete((void *)type_local.id,
                      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index - type_local.id);
    }
    if (auStack_58 == (undefined1  [8])0x0) {
      return (Type)uVar13;
    }
    operator_delete((void *)auStack_58,
                    (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_58);
    return (Type)uVar13;
  }
  cVar5 = wasm::Type::isRef();
  if (cVar5 == '\0') {
    if (local_78 < 7) {
      return (Type)local_78;
    }
    wasm::handle_unreachable
              ("unexpected type kind",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x21c);
  }
  uVar13 = wasm::Type::getHeapType();
  iVar6 = wasm::Type::getNullability();
  if (iVar6 != 1) {
    Random::upTo(this->rand,2);
  }
  auStack_58 = (undefined1  [8])0x0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  type_local.id = uVar13;
  _Var8._M_cur = (__node_type *)
                 std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->typeIndices)._M_h,(key_type *)&type_local);
  if (_Var8._M_cur != (__node_type *)0x0) {
    _Var9._4_4_ = 0;
    _Var9._M_payload._M_value = *(uint *)((long)_Var8._M_cur + 0x10);
    do {
      local_38.id = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                   (iterator)
                   types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_38);
      }
      else {
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      _Var9 = *(_Optional_payload_base<unsigned_int> *)
               ((this->supertypeIndices).
                super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start + ((ulong)_Var9 & 0xffffffff));
    } while (((ulong)_Var9 >> 0x20 & 1) != 0);
    pvVar2 = (this->typeKinds).
             super__Vector_base<std::variant<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar2 == (pointer)0x0) {
LAB_00153d57:
      type_local.id =
           (uintptr_t)
           *(uint *)&pvVar2[*(uint *)((long)_Var8._M_cur + 0x10)].
                     super__Variant_base<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Move_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Copy_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      ;
      bVar4 = true;
    }
    else {
      _Var1 = *(__index_type *)
               ((long)&pvVar2[*(uint *)((long)_Var8._M_cur + 0x10)].
                       super__Variant_base<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                       .
                       super__Move_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                       .
                       super__Copy_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               + 4);
      if (_Var1 == '\x01') {
        local_38.id = 1;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 1;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        pvVar10 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                            (this->rand,
                             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      }
      else if (_Var1 == '\x02') {
        local_38.id = 5;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 5;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        local_38.id = 3;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 3;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        local_38.id = 2;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 2;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        pvVar10 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                            (this->rand,
                             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      }
      else {
        if (_Var1 != '\x03') goto LAB_00153d57;
        local_38.id = 6;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 6;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        local_38.id = 3;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 3;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        local_38.id = 2;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 2;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        pvVar10 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                            (this->rand,
                             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      }
      _Var8._M_cur = (__node_type *)pvVar10->id;
      bVar4 = false;
    }
    NVar14 = (Nullability)_Var8._M_cur;
    if (!bVar4) goto LAB_00154017;
  }
  if (0xd < type_local.id) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1c4,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start ==
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    _M_realloc_insert<wasm::HeapType_const&>
              ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_58,
               (iterator)
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start,(HeapType *)&type_local);
  }
  else {
    (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
     super__Vector_impl_data._M_start)->id = (uintptr_t)type_local;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start =
         types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
  }
  if (0xd < type_local.id) {
    __assert_fail("isBasic() && \"Basic heap type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0x189,"BasicHeapType wasm::HeapType::getBasic() const");
  }
  switch((int)type_local.id) {
  case 3:
    local_38.id = 2;
    if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
      _M_realloc_insert<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                 (iterator)
                 types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_38);
    }
    else {
LAB_00153fea:
      local_38.id = 2;
      (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = 2;
LAB_00153ff1:
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    break;
  case 4:
  case 5:
  case 6:
    local_38.id = 3;
    if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
      _M_realloc_insert<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
                 (iterator)
                 types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_38);
    }
    else {
      (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = 3;
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    local_38.id = 2;
    if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start !=
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00153fea;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
               (iterator)
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start,&local_38);
    break;
  case 7:
  case 8:
  case 9:
  case 10:
    local_38.id = 2;
    if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start !=
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00153fea;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
               (iterator)
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start,&local_38);
    break;
  case 0xb:
    HVar11 = pickSubAny(this);
    NVar14 = (Nullability)HVar11.id;
    goto LAB_00154017;
  case 0xc:
    local_38.id = 0;
    if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start !=
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = 0;
      goto LAB_00153ff1;
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
               (iterator)
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start,&local_38);
    break;
  case 0xd:
    HVar11 = pickSubFunc(this);
    NVar14 = (Nullability)HVar11.id;
    goto LAB_00154017;
  }
  if (auStack_58 ==
      (undefined1  [8])
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assert_fail("!candidates.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1e2,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  pvVar10 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                      (this->rand,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
  NVar14 = (Nullability)pvVar10->id;
LAB_00154017:
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  uVar13 = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,NVar14);
  return (Type)uVar13;
}

Assistant:

Type generateSupertype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSupertype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSuperRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have supertypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }